

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O0

QHostInfo QHostInfo::fromName(QString *name)

{
  Type *name_00;
  QHostInfoPrivate *in_RDI;
  QHostInfoLookupManager *manager;
  QHostInfo *hostInfo;
  QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>_>
  *in_stack_ffffffffffffffc8;
  QHostInfoPrivate *info;
  QString *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar1;
  
  uVar1 = 0;
  *(undefined8 *)in_RDI = 0xaaaaaaaaaaaaaaaa;
  info = in_RDI;
  QHostInfoAgent::fromName(in_stack_ffffffffffffffe0);
  name_00 = QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>_>
            ::operator()(in_stack_ffffffffffffffc8);
  QHostInfoCache::put((QHostInfoCache *)CONCAT17(uVar1,in_stack_ffffffffffffffe8),(QString *)name_00
                      ,(QHostInfo *)info);
  return (QHostInfo)in_RDI;
}

Assistant:

QHostInfo QHostInfo::fromName(const QString &name)
{
#if defined QHOSTINFO_DEBUG
    qDebug("QHostInfo::fromName(\"%s\")",name.toLatin1().constData());
#endif

#ifdef Q_OS_WASM
    return QHostInfoAgent::lookup(name);
#else
    QHostInfo hostInfo = QHostInfoAgent::fromName(name);
    QHostInfoLookupManager* manager = theHostInfoLookupManager();
    manager->cache.put(name, hostInfo);
    return hostInfo;
#endif
}